

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImDrawList_PathLineTo(ImDrawList *self,ImVec2 pos)

{
  ImDrawList *self_local;
  ImVec2 pos_local;
  
  self_local = (ImDrawList *)pos;
  ImDrawList::PathLineTo(self,(ImVec2 *)&self_local);
  return;
}

Assistant:

CIMGUI_API void ImDrawList_PathLineTo(ImDrawList* self,const ImVec2 pos)
{
    return self->PathLineTo(pos);
}